

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void __thiscall
Gudhi::Simplex_tree<Options_with_int_data>::root_members_recursive_deletion
          (Simplex_tree<Options_with_int_data> *this)

{
  Siblings *sib;
  pointer ppVar1;
  iterator sh;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
  local_18;
  
  ppVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
  local_18.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
        *)ppVar1;
  while (local_18.m_ptr !=
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>
          *)(ppVar1 + (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size)) {
    sib = ((local_18.m_ptr)->second).children_;
    if (sib->parent_ == (local_18.m_ptr)->first) {
      rec_delete(this,sib);
    }
    boost::container::
    vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Options_with_int_data>_>_>_*,_false>
    ::operator++(&local_18);
    ppVar1 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
  }
  (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  return;
}

Assistant:

void root_members_recursive_deletion() {
    for (auto sh = root_.members().begin(); sh != root_.members().end(); ++sh) {
      if (has_children(sh)) {
        rec_delete(sh->second.children());
      }
    }
    root_.members().clear();
  }